

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O0

void __thiscall
nanojson3::json::json_writer<std::ostreambuf_iterator<char,_std::char_traits<char>_>_>::write_string
          (json_writer<std::ostreambuf_iterator<char,_std::char_traits<char>_>_> *this,
          js_string_view val)

{
  string_view view;
  bool bVar1;
  const_iterator pvVar2;
  const_reference pvVar3;
  undefined1 local_50 [8];
  value_type p;
  value_type_conflict c;
  const_iterator __end2;
  const_iterator __begin2;
  js_string_view *__range2;
  json_writer<std::ostreambuf_iterator<char,_std::char_traits<char>_>_> *this_local;
  js_string_view val_local;
  
  val_local._M_len = (size_t)val._M_str;
  this_local = (json_writer<std::ostreambuf_iterator<char,_std::char_traits<char>_>_> *)val._M_len;
  output_stream::operator<<(&this->output_,'\"');
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  for (; __end2 != pvVar2; __end2 = __end2 + 1) {
    p._M_str._7_1_ = *__end2;
    pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_256UL>::operator[]
                       (&write_string::char_table_,(ulong)p._M_str._7_1_);
    local_50 = (undefined1  [8])pvVar3->_M_len;
    p._M_len = (size_t)pvVar3->_M_str;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
    if (bVar1) {
      output_stream::operator<<(&this->output_,p._M_str._7_1_);
    }
    else {
      view._M_str = (char *)p._M_len;
      view._M_len = (size_t)local_50;
      output_stream::operator<<(&this->output_,view);
    }
  }
  output_stream::operator<<(&this->output_,'\"');
  return;
}

Assistant:

void write_string(const js_string_view val)
        {
            using namespace std::string_view_literals;

            output_ << '"';
            for (auto c : val)
            {
                static constexpr std::array<std::string_view, 256> char_table_
                {
                    /* 00 */"\\u0000", "\\u0001", "\\u0002", "\\u0003", "\\u0004", "\\u0005", "\\u0006", "\\u0007", "\\b", "\\t", "\\n", "\\u000B", "\\u000C", "\\r", "\\u000E", "\\u000F",
                    /* 10 */"\\u0010", "\\u0011", "\\f", "\\u0013", "\\u0014", "\\u0015", "\\u0016", "\\u0017", "\\u0018", "\\u0019", "\\u001A", "\\u001B", "\\u001C", "\\u001D", "\\u001E", "\\u001F",
                    /* 20 */{}, {}, "\\\"", {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, "\\/",
                    /* 30 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {},
                    /* 40 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {},
                    /* 50 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, "\\\\", {}, {}, {},
                    /* 60 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {},
                    /* 70 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, "\\u007F",
                    /* 80 */{}, // ... continue to 0xFF
                };

                if (auto p = char_table_[static_cast<uint8_t>(c)]; !p.empty())
                    output_ << p;
                else
                    output_ << c;
            }
            output_ << '"';
        }